

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_startup(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  int iVar1;
  uint32_t uVar2;
  int rc;
  libssh2_socket_t sock_local;
  LIBSSH2_SESSION *session_local;
  
  if (session->startup_state == libssh2_NB_state_idle) {
    if (sock == -1) {
      iVar1 = _libssh2_error(session,-0x2d,"Bad socket provided");
      return iVar1;
    }
    session->socket_fd = sock;
    iVar1 = get_socket_nonblocking(session->socket_fd);
    session->socket_prev_blockstate = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    if ((session->socket_prev_blockstate != 0) &&
       (iVar1 = session_nonblock(session->socket_fd,1), iVar1 != 0)) {
      iVar1 = _libssh2_error(session,iVar1,
                             "Failed changing socket\'s blocking state to non-blocking");
      return iVar1;
    }
    session->startup_state = libssh2_NB_state_created;
  }
  if (session->startup_state == libssh2_NB_state_created) {
    iVar1 = banner_send(session);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      iVar1 = _libssh2_error(session,iVar1,"Failed sending banner");
      return iVar1;
    }
    session->startup_state = libssh2_NB_state_sent;
    session->banner_TxRx_state = libssh2_NB_state_idle;
  }
  if (session->startup_state == libssh2_NB_state_sent) {
    do {
      iVar1 = banner_receive(session);
      if (iVar1 == -0x25) {
        return -0x25;
      }
      if (iVar1 != 0) {
        iVar1 = _libssh2_error(session,iVar1,"Failed getting banner");
        return iVar1;
      }
      iVar1 = strncmp("SSH-",(char *)(session->remote).banner,4);
    } while (iVar1 != 0);
    session->startup_state = libssh2_NB_state_sent1;
  }
  if (session->startup_state == libssh2_NB_state_sent1) {
    iVar1 = _libssh2_kex_exchange(session,0,&session->startup_key_state);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      iVar1 = _libssh2_error(session,iVar1,"Unable to exchange encryption keys");
      return iVar1;
    }
    session->startup_state = libssh2_NB_state_sent2;
  }
  if (session->startup_state == libssh2_NB_state_sent2) {
    session->startup_service[0] = '\x05';
    _libssh2_htonu32(session->startup_service + 1,0xc);
    session->startup_service[5] = 's';
    session->startup_service[6] = 's';
    session->startup_service[7] = 'h';
    session->startup_service[8] = '-';
    session->startup_service[9] = 'u';
    session->startup_service[10] = 's';
    session->startup_service[0xb] = 'e';
    session->startup_service[0xc] = 'r';
    session->startup_service[0xd] = 'a';
    session->startup_service[0xe] = 'u';
    session->startup_service[0xf] = 't';
    session->startup_service[0x10] = 'h';
    session->startup_state = libssh2_NB_state_sent3;
  }
  if (session->startup_state == libssh2_NB_state_sent3) {
    iVar1 = _libssh2_transport_send(session,session->startup_service,0x11,(uchar *)0x0,0);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      iVar1 = _libssh2_error(session,iVar1,"Unable to ask for ssh-userauth service");
      return iVar1;
    }
    session->startup_state = libssh2_NB_state_sent4;
  }
  if (session->startup_state == libssh2_NB_state_sent4) {
    iVar1 = _libssh2_packet_require
                      (session,'\x06',&session->startup_data,&session->startup_data_len,0,
                       (uchar *)0x0,0,&session->startup_req_state);
    if (iVar1 == 0) {
      if (session->startup_data_len < 5) {
        session_local._4_4_ = _libssh2_error(session,-0xe,"Unexpected packet length");
      }
      else {
        uVar2 = _libssh2_ntohu32(session->startup_data + 1);
        session->startup_service_length = (ulong)uVar2;
        if ((session->startup_service_length == 0xc) &&
           (iVar1 = strncmp("ssh-userauth",(char *)(session->startup_data + 5),
                            session->startup_service_length), iVar1 == 0)) {
          (*session->free)(session->startup_data,&session->abstract);
          session->startup_data = (uchar *)0x0;
          session->startup_state = libssh2_NB_state_idle;
          session_local._4_4_ = 0;
        }
        else {
          (*session->free)(session->startup_data,&session->abstract);
          session->startup_data = (uchar *)0x0;
          session_local._4_4_ = _libssh2_error(session,-0xe,"Invalid response received from server")
          ;
        }
      }
    }
    else {
      session_local._4_4_ =
           _libssh2_error(session,iVar1,"Failed to get response to ssh-userauth request");
    }
  }
  else {
    session_local._4_4_ = -0x22;
  }
  return session_local._4_4_;
}

Assistant:

static int
session_startup(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    if(session->startup_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "session_startup for socket %d", sock));
        if(LIBSSH2_INVALID_SOCKET == sock) {
            /* Did we forget something? */
            return _libssh2_error(session, LIBSSH2_ERROR_BAD_SOCKET,
                                  "Bad socket provided");
        }
        session->socket_fd = sock;

        session->socket_prev_blockstate =
            !get_socket_nonblocking(session->socket_fd);

        if(session->socket_prev_blockstate) {
            /* If in blocking state change to non-blocking */
            rc = session_nonblock(session->socket_fd, 1);
            if(rc) {
                return _libssh2_error(session, rc,
                                      "Failed changing socket's "
                                      "blocking state to non-blocking");
            }
        }

        session->startup_state = libssh2_NB_state_created;
    }

    if(session->startup_state == libssh2_NB_state_created) {
        rc = banner_send(session);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return rc;
        else if(rc) {
            return _libssh2_error(session, rc,
                                  "Failed sending banner");
        }
        session->startup_state = libssh2_NB_state_sent;
        session->banner_TxRx_state = libssh2_NB_state_idle;
    }

    if(session->startup_state == libssh2_NB_state_sent) {
        do {
            rc = banner_receive(session);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return rc;
            else if(rc)
                return _libssh2_error(session, rc,
                                      "Failed getting banner");
        } while(strncmp("SSH-", (const char *)session->remote.banner, 4));

        session->startup_state = libssh2_NB_state_sent1;
    }

    if(session->startup_state == libssh2_NB_state_sent1) {
        rc = _libssh2_kex_exchange(session, 0, &session->startup_key_state);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return rc;
        else if(rc)
            return _libssh2_error(session, rc,
                                  "Unable to exchange encryption keys");

        session->startup_state = libssh2_NB_state_sent2;
    }

    if(session->startup_state == libssh2_NB_state_sent2) {
        _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                       "Requesting userauth service"));

        /* Request the userauth service */
        session->startup_service[0] = SSH_MSG_SERVICE_REQUEST;
        _libssh2_htonu32(session->startup_service + 1,
                         sizeof("ssh-userauth") - 1);
        memcpy(session->startup_service + 5, "ssh-userauth",
               sizeof("ssh-userauth") - 1);

        session->startup_state = libssh2_NB_state_sent3;
    }

    if(session->startup_state == libssh2_NB_state_sent3) {
        rc = _libssh2_transport_send(session, session->startup_service,
                                     sizeof("ssh-userauth") + 5 - 1,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN)
            return rc;
        else if(rc) {
            return _libssh2_error(session, rc,
                                  "Unable to ask for ssh-userauth service");
        }

        session->startup_state = libssh2_NB_state_sent4;
    }

    if(session->startup_state == libssh2_NB_state_sent4) {
        rc = _libssh2_packet_require(session, SSH_MSG_SERVICE_ACCEPT,
                                     &session->startup_data,
                                     &session->startup_data_len, 0, NULL, 0,
                                     &session->startup_req_state);
        if(rc)
            return _libssh2_error(session, rc,
                                  "Failed to get response to "
                                  "ssh-userauth request");

        if(session->startup_data_len < 5) {
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Unexpected packet length");
        }

        session->startup_service_length =
            _libssh2_ntohu32(session->startup_data + 1);


        if((session->startup_service_length != (sizeof("ssh-userauth") - 1))
            || strncmp("ssh-userauth",
                       (const char *) session->startup_data + 5,
                       session->startup_service_length)) {
            LIBSSH2_FREE(session, session->startup_data);
            session->startup_data = NULL;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Invalid response received from server");
        }
        LIBSSH2_FREE(session, session->startup_data);
        session->startup_data = NULL;

        session->startup_state = libssh2_NB_state_idle;

        return 0;
    }

    /* just for safety return some error */
    return LIBSSH2_ERROR_INVAL;
}